

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNew
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,ArrayNew *curr)

{
  bool bVar1;
  uint uVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  Literal *pLVar4;
  Literal local_220;
  uint local_204;
  undefined1 local_200 [4];
  Index i_1;
  undefined1 local_1e8 [8];
  Literal value;
  HeapType local_1c8;
  uintptr_t uStack_1c0;
  undefined1 auStack_1b8 [8];
  Field field;
  uint local_19c;
  Index i;
  undefined1 local_190 [8];
  Literal zero;
  Literals data;
  Index num;
  uintptr_t *local_128;
  Field *element;
  HeapType heapType;
  undefined1 local_110 [8];
  Flow size;
  Flow local_c0;
  undefined1 local_68 [8];
  Flow init;
  ArrayNew *curr_local;
  ExpressionRunner<wasm::ModuleRunner> *this_local;
  Flow *init_1;
  
  init.breakTo.super_IString.str._M_str = (char *)curr;
  Flow::Flow((Flow *)local_68);
  bVar1 = ArrayNew::isWithDefault((ArrayNew *)init.breakTo.super_IString.str._M_str);
  if (!bVar1) {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    visit(&local_c0,pEVar3,*(Expression **)(init.breakTo.super_IString.str._M_str + 0x10));
    Flow::operator=((Flow *)local_68,&local_c0);
    Flow::~Flow(&local_c0);
    bVar1 = Flow::breaking((Flow *)local_68);
    if (bVar1) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      size.breakTo.super_IString.str._M_str._4_4_ = 1;
      goto LAB_0274dcba;
    }
  }
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  visit((Flow *)local_110,pEVar3,*(Expression **)(init.breakTo.super_IString.str._M_str + 0x18));
  bVar1 = Flow::breaking((Flow *)local_110);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_110);
    size.breakTo.super_IString.str._M_str._4_4_ = 1;
  }
  else {
    heapType.id._4_4_ = 1;
    bVar1 = wasm::Type::operator==
                      ((Type *)(init.breakTo.super_IString.str._M_str + 8),
                       (BasicType *)((long)&heapType.id + 4));
    if (bVar1) {
      heapType.id._3_1_ = 0;
      pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      visit(__return_storage_ptr__,pEVar3,
            *(Expression **)(init.breakTo.super_IString.str._M_str + 0x10));
      bVar1 = Flow::breaking(__return_storage_ptr__);
      if (!bVar1) {
        __assert_fail("init.breaking()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0x74f,
                      "Flow wasm::ExpressionRunner<wasm::ModuleRunner>::visitArrayNew(ArrayNew *) [SubType = wasm::ModuleRunner]"
                     );
      }
      size.breakTo.super_IString.str._M_str._4_4_ = 1;
      heapType.id._3_1_ = 1;
    }
    else {
      element = (Field *)wasm::Type::getHeapType
                                   ((Type *)(init.breakTo.super_IString.str._M_str + 8));
      HeapType::getArray((HeapType *)&stack0xfffffffffffffec8);
      local_128 = (uintptr_t *)&stack0xfffffffffffffec8;
      pLVar4 = Flow::getSingleValue((Flow *)local_110);
      uVar2 = wasm::Literal::geti32(pLVar4);
      if (0x2aaaaa9 < uVar2) {
        (*this->_vptr_ExpressionRunner[3])(this,"allocation failure");
      }
      Literals::Literals((Literals *)&zero.type,(ulong)uVar2);
      bVar1 = ArrayNew::isWithDefault((ArrayNew *)init.breakTo.super_IString.str._M_str);
      if (bVar1) {
        wasm::Literal::makeZero((Literal *)local_190,(Type)*local_128);
        for (local_19c = 0; local_19c < uVar2; local_19c = local_19c + 1) {
          pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                             ((SmallVector<wasm::Literal,_1UL> *)&zero.type,(ulong)local_19c);
          wasm::Literal::operator=(pLVar4,(Literal *)local_190);
        }
        wasm::Literal::~Literal((Literal *)local_190);
      }
      else {
        value.type.id =
             (uintptr_t)wasm::Type::getHeapType((Type *)(init.breakTo.super_IString.str._M_str + 8))
        ;
        HeapType::getArray(&local_1c8);
        auStack_1b8 = (undefined1  [8])local_1c8.id;
        field.type.id = uStack_1c0;
        pLVar4 = Flow::getSingleValue((Flow *)local_68);
        wasm::Literal::Literal((Literal *)local_200,pLVar4);
        truncateForPacking((Literal *)local_1e8,this,(Literal *)local_200,(Field *)auStack_1b8);
        wasm::Literal::~Literal((Literal *)local_200);
        for (local_204 = 0; local_204 < uVar2; local_204 = local_204 + 1) {
          pLVar4 = SmallVector<wasm::Literal,_1UL>::operator[]
                             ((SmallVector<wasm::Literal,_1UL> *)&zero.type,(ulong)local_204);
          wasm::Literal::operator=(pLVar4,(Literal *)local_1e8);
        }
        wasm::Literal::~Literal((Literal *)local_1e8);
      }
      makeGCData(&local_220,this,(Literals *)&zero.type,
                 (Type)*(uintptr_t *)(init.breakTo.super_IString.str._M_str + 8));
      Flow::Flow(__return_storage_ptr__,&local_220);
      wasm::Literal::~Literal(&local_220);
      size.breakTo.super_IString.str._M_str._4_4_ = 1;
      Literals::~Literals((Literals *)&zero.type);
    }
  }
  Flow::~Flow((Flow *)local_110);
LAB_0274dcba:
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitArrayNew(ArrayNew* curr) {
    NOTE_ENTER("ArrayNew");
    Flow init;
    if (!curr->isWithDefault()) {
      init = self()->visit(curr->init);
      if (init.breaking()) {
        return init;
      }
    }
    auto size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    if (curr->type == Type::unreachable) {
      // We cannot proceed to compute the heap type, as there isn't one. Just
      // visit the unreachable child, and stop there.
      auto init = self()->visit(curr->init);
      assert(init.breaking());
      return init;
    }
    auto heapType = curr->type.getHeapType();
    const auto& element = heapType.getArray().element;
    Index num = size.getSingleValue().geti32();
    if (num >= DataLimit) {
      hostLimit("allocation failure");
    }
    Literals data(num);
    if (curr->isWithDefault()) {
      auto zero = Literal::makeZero(element.type);
      for (Index i = 0; i < num; i++) {
        data[i] = zero;
      }
    } else {
      auto field = curr->type.getHeapType().getArray().element;
      auto value = truncateForPacking(init.getSingleValue(), field);
      for (Index i = 0; i < num; i++) {
        data[i] = value;
      }
    }
    return makeGCData(std::move(data), curr->type);
  }